

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O2

Polynomial<double> *
rtb::Filter::multiply<double>
          (Polynomial<double> *__return_storage_ptr__,Polynomial<double> *p1,Polynomial<double> *p2)

{
  size_t sVar1;
  size_t sVar2;
  undefined8 uVar3;
  const_reference pvVar4;
  reference pvVar5;
  reference __y;
  const_reference __y_00;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  size_type sVar9;
  double extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  double in_XMM1_Qb;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> resultCoefficients;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  it;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> temp2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> temp1;
  Polynomial<double> polyResult;
  allocator_type local_f9;
  Polynomial<double> *local_f8;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_f0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_b8;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_b0;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_98;
  Polynomial<double> local_80;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_58;
  complex<double> *local_40;
  pointer local_38;
  
  sVar1 = p2->order_;
  sVar2 = p1->order_;
  local_f8 = __return_storage_ptr__;
  Polynomial<double>::Polynomial(__return_storage_ptr__,sVar1 + sVar2);
  lVar6 = sVar1 + sVar2;
  if (lVar6 == 0) {
    pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                       (&p1->coefficients_,0);
    __y_00 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                       (&p2->coefficients_,0);
    std::operator*(pvVar4,__y_00);
    local_d8 = in_XMM1_Qa;
    local_c8 = (double)extraout_XMM0_Qa_00;
    pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                       (&local_f8->coefficients_,0);
    *(double *)pvVar5->_M_value = local_c8;
    *(double *)(pvVar5->_M_value + 8) = local_d8;
  }
  else {
    sVar9 = lVar6 * 2 + 1;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_f0,
               sVar9,(allocator_type *)&local_80);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_98,
               sVar9,(allocator_type *)&local_80);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_b0,
               sVar9,(allocator_type *)&local_80);
    for (uVar7 = 0; uVar8 = (ulong)uVar7, uVar8 < p1->size_; uVar7 = uVar7 + 1) {
      pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                         (&p1->coefficients_,uVar8);
      pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          &local_98,uVar8);
      uVar3 = *(undefined8 *)(pvVar4->_M_value + 8);
      *(undefined8 *)pvVar5->_M_value = *(undefined8 *)pvVar4->_M_value;
      *(undefined8 *)(pvVar5->_M_value + 8) = uVar3;
    }
    for (uVar7 = 0; uVar8 = (ulong)uVar7, uVar8 < p2->size_; uVar7 = uVar7 + 1) {
      pvVar4 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                         (&p2->coefficients_,uVar8);
      pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                         ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                          &local_b0,uVar8);
      uVar3 = *(undefined8 *)(pvVar4->_M_value + 8);
      *(undefined8 *)pvVar5->_M_value = *(undefined8 *)pvVar4->_M_value;
      *(undefined8 *)(pvVar5->_M_value + 8) = uVar3;
    }
    uVar8 = 0;
    while( true ) {
      if (((long)local_f0._M_impl.super__Vector_impl_data._M_finish -
           (long)local_f0._M_impl.super__Vector_impl_data._M_start >> 4) - 1U <= uVar8) break;
      sVar9 = uVar8 & 0xffffffff;
      for (uVar7 = 0; uVar7 <= uVar8; uVar7 = uVar7 + 1) {
        pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                           ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                            &local_98,(ulong)uVar7);
        __y = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                        ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                         &local_b0,sVar9);
        std::operator*(pvVar5,__y);
        local_d8 = in_XMM1_Qa;
        dStack_d0 = in_XMM1_Qb;
        local_c8 = extraout_XMM0_Qa;
        pvVar5 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::at
                           ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                            &local_f0,uVar8);
        in_XMM1_Qa = local_c8 + *(double *)pvVar5->_M_value;
        in_XMM1_Qb = local_d8 + *(double *)(pvVar5->_M_value + 8);
        *(double *)pvVar5->_M_value = in_XMM1_Qa;
        *(double *)(pvVar5->_M_value + 8) = in_XMM1_Qb;
        sVar9 = (size_type)((int)sVar9 - 1);
      }
      uVar8 = uVar8 + 1;
    }
    local_38 = local_f0._M_impl.super__Vector_impl_data._M_finish;
    local_40 = local_f0._M_impl.super__Vector_impl_data._M_start;
    std::
    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>,rtb::Filter::multiply<double>(rtb::Filter::Polynomial<double>const&,rtb::Filter::Polynomial<double>const&)::_lambda(std::complex<double>)_1_>
              (&local_b8);
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    vector<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,void>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_58,
               (__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                )local_f0._M_impl.super__Vector_impl_data._M_start,local_b8,&local_f9);
    Polynomial<double>::Polynomial
              (&local_80,
               (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_58);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              (&local_58);
    Polynomial<double>::operator=(local_f8,&local_80);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               &local_80);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              (&local_b0);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              (&local_98);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              (&local_f0);
  }
  return local_f8;
}

Assistant:

Polynomial<T> multiply(const Polynomial<T>& p1, const Polynomial<T>& p2) {

            typedef typename Polynomial<T>::Complex Complex;

            size_t resultOrder(p1.getOrder() + p2.getOrder());
            Polynomial<T> result(resultOrder);
            if (resultOrder == 0) {
                result.coefficients_.at(0) = p1.coefficients_.at(0)*p2.coefficients_.at(0);
            }
            else {
                std::vector<Complex> resultCoefficients(2 * resultOrder + 1);
                std::vector<Complex> temp1(2 * resultOrder + 1), temp2(2 * resultOrder + 1);
                for (unsigned i{ 0 }; i < p1.getSize(); ++i)
                    temp1.at(i) = p1.coefficients_.at(i);

                for (unsigned i{ 0 }; i < p2.getSize(); ++i)
                    temp2.at(i) = p2.coefficients_.at(i);

                for (unsigned k{ 0 }; k < resultCoefficients.size() - 1; ++k)
                    for (unsigned i{ 0 }; i <= k; ++i)
                        resultCoefficients.at(k) += temp1.at(i)*temp2.at(k - i);

                auto it = std::find_if(resultCoefficients.rbegin(), resultCoefficients.rend(), [](Complex v){ return std::abs(v) != 0;      });

                Polynomial<T> polyResult(std::vector<Complex>(resultCoefficients.begin(), it.base()));
                result = polyResult;
            }
            return result;
        }